

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomBernoulliLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randombernoullilike(NeuralNetworkLayer *this)

{
  bool bVar1;
  RandomBernoulliLikeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_randombernoullilike(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randombernoullilike(this);
    this_00 = (RandomBernoulliLikeLayerParams *)operator_new(0x20);
    RandomBernoulliLikeLayerParams::RandomBernoulliLikeLayerParams(this_00);
    (this->layer_).randombernoullilike_ = this_00;
  }
  return (RandomBernoulliLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliLikeLayerParams* NeuralNetworkLayer::mutable_randombernoullilike() {
  if (!has_randombernoullilike()) {
    clear_layer();
    set_has_randombernoullilike();
    layer_.randombernoullilike_ = new ::CoreML::Specification::RandomBernoulliLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomBernoulliLike)
  return layer_.randombernoullilike_;
}